

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void add_pass_code(Grammar *g,Rule *r,char *pass_start,char *pass_end,char *code_start,
                  char *code_end,uint pass_line,uint code_line)

{
  uint uVar1;
  D_Pass *pDVar2;
  char *pcVar3;
  Code *pCVar4;
  D_Pass *p;
  char *code_end_local;
  char *code_start_local;
  char *pass_end_local;
  char *pass_start_local;
  Rule *r_local;
  Grammar *g_local;
  
  pDVar2 = find_pass(g,pass_start,pass_end);
  if (pDVar2 == (D_Pass *)0x0) {
    pcVar3 = dup_str(pass_start,pass_end);
    d_fail("unknown pass \'%s\' line %d",pcVar3,(ulong)pass_line);
  }
  do {
    while( true ) {
      while( true ) {
        if (pDVar2->index < (r->pass_code).n) {
          pCVar4 = (Code *)malloc(0x10);
          (r->pass_code).v[pDVar2->index] = pCVar4;
          pcVar3 = dup_str(code_start,code_end);
          (r->pass_code).v[pDVar2->index]->code = pcVar3;
          (r->pass_code).v[pDVar2->index]->line = code_line;
          return;
        }
        if ((r->pass_code).v != (Code **)0x0) break;
        (r->pass_code).v = (r->pass_code).e;
        uVar1 = (r->pass_code).n;
        (r->pass_code).n = uVar1 + 1;
        (r->pass_code).e[uVar1] = (Code *)0x0;
      }
      if ((r->pass_code).v != (r->pass_code).e) break;
      if ((r->pass_code).n < 3) {
        uVar1 = (r->pass_code).n;
        (r->pass_code).n = uVar1 + 1;
        (r->pass_code).v[uVar1] = (Code *)0x0;
      }
      else {
LAB_0013f44d:
        vec_add_internal(&r->pass_code,(void *)0x0);
      }
    }
    if (((r->pass_code).n & 7) == 0) goto LAB_0013f44d;
    uVar1 = (r->pass_code).n;
    (r->pass_code).n = uVar1 + 1;
    (r->pass_code).v[uVar1] = (Code *)0x0;
  } while( true );
}

Assistant:

void add_pass_code(Grammar *g, Rule *r, char *pass_start, char *pass_end, char *code_start, char *code_end,
                   uint pass_line, uint code_line) {
  D_Pass *p = find_pass(g, pass_start, pass_end);
  if (!p) d_fail("unknown pass '%s' line %d", dup_str(pass_start, pass_end), pass_line);
  while (r->pass_code.n <= p->index) vec_add(&r->pass_code, NULL);
  r->pass_code.v[p->index] = MALLOC(sizeof(Code));
  r->pass_code.v[p->index]->code = dup_str(code_start, code_end);
  r->pass_code.v[p->index]->line = code_line;
}